

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getsockname.c
# Opt level: O0

int run_test_getsockname_udp(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  int local_c;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  iVar1 = udp_listener();
  if (iVar1 == 0) {
    udp_sender();
    uv_run(::loop,0);
    if (getsocknamecount != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x162,"getsocknamecount == 2");
      abort();
    }
    if (udp.send_queue_size != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x164,"udp.send_queue_size == 0");
      abort();
    }
    if (udpServer.send_queue_size != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x165,"udpServer.send_queue_size == 0");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getsockname.c"
              ,0x167,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  return local_c;
}

Assistant:

TEST_IMPL(getsockname_udp) {
  loop = uv_default_loop();

  if (udp_listener())
    return 1;

  udp_sender();

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(getsocknamecount == 2);

  ASSERT(udp.send_queue_size == 0);
  ASSERT(udpServer.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}